

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::try_statement::~try_statement(try_statement *this)

{
  try_statement *this_local;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__try_statement_002928f0;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
            (&this->finally_);
  std::__cxx11::wstring::~wstring((wstring *)&this->catch_id_);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr(&this->catch_);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr(&this->block_);
  statement::~statement(&this->super_statement);
  return;
}

Assistant:

explicit try_statement(const source_extend& extend, statement_ptr&& block, statement_ptr&& catch_, const std::wstring& catch_id, statement_ptr&& finally_)
        : statement(extend)
        , block_(std::move(block))
        , catch_(std::move(catch_))
        , catch_id_(catch_id)
        , finally_(std::move(finally_)) {
        assert(block_ && block_->type() == statement_type::block);
        assert(!this->catch_ == catch_id_.empty());
        assert(!this->catch_ || this->catch_->type() == statement_type::block);
        assert(!this->finally_ || this->finally_->type() == statement_type::block);
    }